

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstanceSymbols.cpp
# Opt level: O0

void anon_unknown.dwarf_35f635::createImplicitNets
               (HierarchicalInstanceSyntax *instance,ASTContext *context,NetType *netType,
               SmallSet<std::basic_string_view<char,_std::char_traits<char>_>,_8UL,_ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>,_8UL>_>
               *implicitNetNames,SmallVectorBase<const_slang::ast::Symbol_*> *results)

{
  SyntaxKind SVar1;
  bool bVar2;
  PortConnectionSyntax *this;
  OrderedPortConnectionSyntax *pOVar3;
  NamedPortConnectionSyntax *pNVar4;
  Compilation *this_00;
  NetSymbol *this_01;
  Type *type;
  string_view sVar5;
  pair<ska::detailv3::sherwood_v3_table<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::functor_storage<unsigned_long,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::functor_storage<bool,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>,_8UL>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>,_8UL>_>::templated_iterator<std::basic_string_view<char,_std::char_traits<char>_>_>,_bool>
  pVar6;
  NetSymbol *local_198;
  SourceLocation local_190;
  string_view local_188;
  NetSymbol *local_178;
  NetSymbol *net;
  Compilation *comp;
  undefined1 local_160;
  string_view local_158;
  EntryPointer local_148;
  undefined1 local_140;
  undefined1 auStack_138 [8];
  Token t;
  iterator __end2;
  iterator __begin2;
  SmallVector<slang::parsing::Token,_8UL> *__range2;
  undefined1 local_100 [8];
  SmallVector<slang::parsing::Token,_8UL> implicitNets;
  PropertyExprSyntax *expr;
  PortConnectionSyntax *conn;
  const_iterator __end1;
  const_iterator __begin1;
  SeparatedSyntaxList<slang::syntax::PortConnectionSyntax> *__range1;
  SmallVectorBase<const_slang::ast::Symbol_*> *results_local;
  SmallSet<std::basic_string_view<char,_std::char_traits<char>_>,_8UL,_ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>,_8UL>_>
  *implicitNetNames_local;
  NetType *netType_local;
  ASTContext *context_local;
  HierarchicalInstanceSyntax *instance_local;
  
  bVar2 = slang::ast::NetType::isError(netType);
  if (!bVar2) {
    join_0x00000010_0x00000000_ =
         slang::syntax::SeparatedSyntaxList<slang::syntax::PortConnectionSyntax>::begin
                   (&instance->connections);
    _conn = slang::syntax::SeparatedSyntaxList<slang::syntax::PortConnectionSyntax>::end
                      (&instance->connections);
    while( true ) {
      bVar2 = slang::
              iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::PortConnectionSyntax>::iterator_base<const_slang::syntax::PortConnectionSyntax_*>,_std::random_access_iterator_tag,_const_slang::syntax::PortConnectionSyntax_*,_unsigned_long,_const_slang::syntax::PortConnectionSyntax_**,_const_slang::syntax::PortConnectionSyntax_*&>
              ::operator!=((iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::PortConnectionSyntax>::iterator_base<const_slang::syntax::PortConnectionSyntax_*>,_std::random_access_iterator_tag,_const_slang::syntax::PortConnectionSyntax_*,_unsigned_long,_const_slang::syntax::PortConnectionSyntax_**,_const_slang::syntax::PortConnectionSyntax_*&>
                            *)&__end1.index,
                           (iterator_base<const_slang::syntax::PortConnectionSyntax_*> *)&conn);
      if (!bVar2) break;
      this = slang::syntax::SeparatedSyntaxList<slang::syntax::PortConnectionSyntax>::
             iterator_base<const_slang::syntax::PortConnectionSyntax_*>::operator*
                       ((iterator_base<const_slang::syntax::PortConnectionSyntax_*> *)&__end1.index)
      ;
      implicitNets.stackBase[0x68] = '\0';
      implicitNets.stackBase[0x69] = '\0';
      implicitNets.stackBase[0x6a] = '\0';
      implicitNets.stackBase[0x6b] = '\0';
      implicitNets.stackBase[0x6c] = '\0';
      implicitNets.stackBase[0x6d] = '\0';
      implicitNets.stackBase[0x6e] = '\0';
      implicitNets.stackBase[0x6f] = '\0';
      SVar1 = (this->super_SyntaxNode).kind;
      if (SVar1 == NamedPortConnection) {
        pNVar4 = slang::syntax::SyntaxNode::as<slang::syntax::NamedPortConnectionSyntax>
                           (&this->super_SyntaxNode);
        implicitNets.stackBase._104_8_ = pNVar4->expr;
      }
      else if (SVar1 == OrderedPortConnection) {
        pOVar3 = slang::syntax::SyntaxNode::as<slang::syntax::OrderedPortConnectionSyntax>
                           (&this->super_SyntaxNode);
        implicitNets.stackBase._104_8_ =
             slang::not_null::operator_cast_to_PropertyExprSyntax_((not_null *)&pOVar3->expr);
      }
      if (implicitNets.stackBase._104_8_ != 0) {
        slang::SmallVector<slang::parsing::Token,_8UL>::SmallVector
                  ((SmallVector<slang::parsing::Token,_8UL> *)local_100);
        slang::ast::Expression::findPotentiallyImplicitNets
                  ((SyntaxNode *)implicitNets.stackBase._104_8_,context,
                   (SmallVectorBase<slang::parsing::Token> *)local_100);
        __end2 = slang::SmallVectorBase<slang::parsing::Token>::begin
                           ((SmallVectorBase<slang::parsing::Token> *)local_100);
        t.info = (Info *)slang::SmallVectorBase<slang::parsing::Token>::end
                                   ((SmallVectorBase<slang::parsing::Token> *)local_100);
        for (; __end2 != (iterator)t.info; __end2 = __end2 + 1) {
          auStack_138._0_2_ = __end2->kind;
          auStack_138[2] = __end2->field_0x2;
          auStack_138[3] = (__end2->numFlags).raw;
          auStack_138._4_4_ = __end2->rawLen;
          t._0_8_ = __end2->info;
          sVar5 = slang::parsing::Token::valueText((Token *)auStack_138);
          local_158 = sVar5;
          pVar6 = ska::
                  flat_hash_set<std::basic_string_view<char,_std::char_traits<char>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>,_8UL>_>
                  ::emplace(&implicitNetNames->
                             super_flat_hash_set<std::basic_string_view<char>,_std::hash<basic_string_view<char,_char_traits<char>_>_>,_std::equal_to<basic_string_view<char,_char_traits<char>_>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char>_>,_8UL>_>
                            ,&local_158);
          comp = (Compilation *)pVar6.first.current;
          local_160 = pVar6.second;
          local_148 = (EntryPointer)comp;
          local_140 = local_160;
          if (((undefined1  [16])pVar6 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            this_00 = slang::ast::ASTContext::getCompilation(context);
            net = (NetSymbol *)this_00;
            sVar5 = slang::parsing::Token::valueText((Token *)auStack_138);
            local_188 = sVar5;
            local_190 = slang::parsing::Token::location((Token *)auStack_138);
            this_01 = slang::BumpAllocator::
                      emplace<slang::ast::NetSymbol,std::basic_string_view<char,std::char_traits<char>>,slang::SourceLocation,slang::ast::NetType_const&>
                                (&this_00->super_BumpAllocator,&local_188,&local_190,netType);
            local_178 = this_01;
            type = slang::ast::Compilation::getLogicType((Compilation *)net);
            slang::ast::ValueSymbol::setType(&this_01->super_ValueSymbol,type);
            local_198 = local_178;
            slang::SmallVectorBase<const_slang::ast::Symbol_*>::push_back
                      (results,(Symbol **)&local_198);
          }
        }
        slang::SmallVector<slang::parsing::Token,_8UL>::~SmallVector
                  ((SmallVector<slang::parsing::Token,_8UL> *)local_100);
      }
      slang::
      iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::PortConnectionSyntax>::iterator_base<const_slang::syntax::PortConnectionSyntax_*>,_std::random_access_iterator_tag,_const_slang::syntax::PortConnectionSyntax_*,_unsigned_long,_const_slang::syntax::PortConnectionSyntax_**,_const_slang::syntax::PortConnectionSyntax_*&>
      ::operator++((iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::PortConnectionSyntax>::iterator_base<const_slang::syntax::PortConnectionSyntax_*>,_std::random_access_iterator_tag,_const_slang::syntax::PortConnectionSyntax_*,_unsigned_long,_const_slang::syntax::PortConnectionSyntax_**,_const_slang::syntax::PortConnectionSyntax_*&>
                    *)&__end1.index);
    }
  }
  return;
}

Assistant:

void createImplicitNets(const HierarchicalInstanceSyntax& instance, const ASTContext& context,
                        const NetType& netType, SmallSet<string_view, 8>& implicitNetNames,
                        SmallVectorBase<const Symbol*>& results) {
    // If no default nettype is set, we don't create implicit nets.
    if (netType.isError())
        return;

    for (auto conn : instance.connections) {
        const PropertyExprSyntax* expr = nullptr;
        switch (conn->kind) {
            case SyntaxKind::OrderedPortConnection:
                expr = conn->as<OrderedPortConnectionSyntax>().expr;
                break;
            case SyntaxKind::NamedPortConnection:
                expr = conn->as<NamedPortConnectionSyntax>().expr;
                break;
            default:
                break;
        }

        if (!expr)
            continue;

        SmallVector<Token, 8> implicitNets;
        Expression::findPotentiallyImplicitNets(*expr, context, implicitNets);

        for (Token t : implicitNets) {
            if (implicitNetNames.emplace(t.valueText()).second) {
                auto& comp = context.getCompilation();
                auto net = comp.emplace<NetSymbol>(t.valueText(), t.location(), netType);
                net->setType(comp.getLogicType());
                results.push_back(net);
            }
        }
    }
}